

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

uint32_t __thiscall duckdb::DecryptionTransport::Finalize(DecryptionTransport *this)

{
  int iVar1;
  undefined8 uVar2;
  ssize_t sVar3;
  EncryptionState *pEVar4;
  undefined4 extraout_var;
  InvalidInputException *this_00;
  size_t in_RDI;
  data_t computed_tag [16];
  string *in_stack_ffffffffffffff18;
  shared_ptr<duckdb::EncryptionState,_true> *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  allocator in_stack_ffffffffffffff5f;
  InternalException *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [27];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  if (*(int *)(in_RDI + 0x103c) != *(int *)(in_RDI + 0x1038)) {
    local_3d = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,
               "DecryptionTransport::Finalize was called with bytes remaining in read buffer: \nread buffer offset: %d, read buffer size: %d"
               ,&local_29);
    InternalException::InternalException<unsigned_int,unsigned_int>
              (in_stack_ffffffffffffff60,
               (string *)
               CONCAT17(in_stack_ffffffffffffff5f,
                        CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)),
               (uint)(in_RDI >> 0x20),(uint)in_RDI);
    local_3d = 0;
    __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
  }
  sVar3 = duckdb_apache::thrift::transport::TTransport::read
                    (*(TTransport **)(in_RDI + 0x10),(int)local_58,(void *)0x10,in_RDI);
  *(int *)(in_RDI + 0x1044) = *(int *)(in_RDI + 0x1044) - (int)sVar3;
  pEVar4 = shared_ptr<duckdb::EncryptionState,_true>::operator->(in_stack_ffffffffffffff20);
  iVar1 = (*pEVar4->_vptr_EncryptionState[5])(pEVar4,in_RDI + 0x28,0,local_58,0x10);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_78,
               "DecryptionTransport::Finalize was called with bytes remaining in AES context out",
               &local_79);
    InternalException::InternalException
              ((InternalException *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
  }
  if (*(int *)(in_RDI + 0x1044) != 0) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff60,
               "Encoded ciphertext length differs from actual ciphertext length",
               (allocator *)&stack0xffffffffffffff5f);
    InvalidInputException::InvalidInputException(this_00,in_stack_ffffffffffffff18);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,
                InvalidInputException::~InvalidInputException);
  }
  return *(int *)(in_RDI + 0x1040) + 4;
}

Assistant:

uint32_t Finalize() {

		if (read_buffer_offset != read_buffer_size) {
			throw InternalException("DecryptionTransport::Finalize was called with bytes remaining in read buffer: \n"
			                        "read buffer offset: %d, read buffer size: %d",
			                        read_buffer_offset, read_buffer_size);
		}

		data_t computed_tag[ParquetCrypto::TAG_BYTES];
		transport_remaining -= trans.read(computed_tag, ParquetCrypto::TAG_BYTES);
		if (aes->Finalize(read_buffer, 0, computed_tag, ParquetCrypto::TAG_BYTES) != 0) {
			throw InternalException("DecryptionTransport::Finalize was called with bytes remaining in AES context out");
		}

		if (transport_remaining != 0) {
			throw InvalidInputException("Encoded ciphertext length differs from actual ciphertext length");
		}

		return ParquetCrypto::LENGTH_BYTES + total_bytes;
	}